

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O1

void wr_messages(void)

{
  uint16_t uVar1;
  uint16_t uVar2;
  char *str;
  short sVar3;
  
  uVar1 = messages_num();
  uVar2 = 0x50;
  if (uVar1 < 0x50) {
    uVar2 = uVar1;
  }
  wr_u16b(uVar2);
  if (uVar1 != 0) {
    sVar3 = uVar2 + 1;
    do {
      str = message_str(sVar3 - 2U);
      wr_string(str);
      uVar2 = message_type(sVar3 - 2U);
      wr_u16b(uVar2);
      sVar3 = sVar3 + -1;
    } while (1 < sVar3);
  }
  return;
}

Assistant:

void wr_messages(void)
{
	int16_t i;
	uint16_t num;

	num = messages_num();
	if (num > 80) num = 80;
	wr_u16b(num);

	/* Dump the messages (oldest first!) */
	for (i = num - 1; i >= 0; i--) {
		wr_string(message_str(i));
		wr_u16b(message_type(i));
	}
}